

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dvbSubStreamReader.cpp
# Opt level: O1

int __thiscall
DVBSubStreamReader::decodeFrame
          (DVBSubStreamReader *this,uint8_t *buff,uint8_t *end,int *skipBytes,int *skipBeforeBytes)

{
  *skipBytes = 0;
  *skipBeforeBytes = 0;
  return 0;
}

Assistant:

int DVBSubStreamReader::decodeFrame(uint8_t* buff, uint8_t* end, int& skipBytes, int& skipBeforeBytes)
{
    skipBytes = 0;
    skipBeforeBytes = 0;
    const int rez = intDecodeFrame(buff, end);
    if (rez <= 0)
        return rez;
    const int64_t currentTime = m_start_display_time;
    const int nextRez = intDecodeFrame(buff + rez, end);
    if (nextRez <= 0)
        return rez;
    m_frameDuration = m_start_display_time - currentTime;
    return rez;
}